

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O0

int fl_parse_color(char *p,uchar *r,uchar *g,uchar *b)

{
  int iVar1;
  undefined1 local_40 [8];
  XColor x;
  uchar *b_local;
  uchar *g_local;
  uchar *r_local;
  char *p_local;
  
  x._8_8_ = b;
  if (fl_display == (Display *)0x0) {
    fl_open_display();
  }
  iVar1 = XParseColor(fl_display,fl_colormap,p,local_40);
  if (iVar1 != 0) {
    *r = x.pixel._1_1_;
    *g = x.pixel._3_1_;
    *(undefined1 *)x._8_8_ = x.pixel._5_1_;
  }
  p_local._4_4_ = (uint)(iVar1 != 0);
  return p_local._4_4_;
}

Assistant:

int fl_parse_color(const char* p, uchar& r, uchar& g, uchar& b) {
  XColor x;
  if (!fl_display) fl_open_display();
  if (XParseColor(fl_display, fl_colormap, p, &x)) {
    r = (uchar)(x.red>>8);
    g = (uchar)(x.green>>8);
    b = (uchar)(x.blue>>8);
    return 1;
  } else return 0;
}